

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O2

void WebPRescalerExportRowExpand_C(WebPRescaler *wrk)

{
  uint8_t *puVar1;
  rescaler_t *prVar2;
  rescaler_t *prVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar6 = wrk->num_channels * wrk->dst_width;
  puVar1 = wrk->dst;
  prVar2 = wrk->frow;
  if (wrk->y_accum == 0) {
    uVar9 = 0;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      iVar8 = (int)((ulong)wrk->fy_scale * (ulong)prVar2[uVar9] + 0x80000000 >> 0x20);
      if (0xff < iVar8) {
        iVar8 = 0xff;
      }
      puVar1[uVar9] = (uint8_t)iVar8;
    }
  }
  else {
    prVar3 = wrk->irow;
    uVar9 = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)wrk->y_sub;
    uVar5 = SUB164((ZEXT416((uint)-wrk->y_accum) << 0x20) / auVar4,0);
    uVar10 = 0;
    if (0 < (int)uVar6) {
      uVar10 = (ulong)uVar6;
    }
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      iVar7 = (int)((ulong)wrk->fy_scale *
                    ((ulong)prVar3[uVar9] * (ulong)uVar5 + (ulong)prVar2[uVar9] * (ulong)-uVar5 +
                     0x80000000 >> 0x20) + 0x80000000 >> 0x20);
      iVar8 = 0xff;
      if (iVar7 < 0x100) {
        iVar8 = iVar7;
      }
      puVar1[uVar9] = (uint8_t)iVar8;
    }
  }
  return;
}

Assistant:

void WebPRescalerExportRowExpand_C(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(wrk->y_expand);
  assert(wrk->y_sub != 0);
  if (wrk->y_accum == 0) {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint32_t J = frow[x_out];
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  } else {
    const uint32_t B = WEBP_RESCALER_FRAC(-wrk->y_accum, wrk->y_sub);
    const uint32_t A = (uint32_t)(WEBP_RESCALER_ONE - B);
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint64_t I = (uint64_t)A * frow[x_out]
                       + (uint64_t)B * irow[x_out];
      const uint32_t J = (uint32_t)((I + ROUNDER) >> WEBP_RESCALER_RFIX);
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  }
}